

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void __thiscall kratos::PortPackedVisitor::visit(PortPackedVisitor *this,Generator *generator)

{
  int iVar1;
  pointer pbVar2;
  shared_ptr<kratos::PortPackedStruct> sVar3;
  shared_ptr<kratos::VarPackedStruct> sVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  __shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2> local_80;
  PortPackedVisitor *local_70;
  undefined1 local_68 [8];
  shared_ptr<kratos::Var> var;
  shared_ptr<kratos::PackedStruct> struct_def;
  undefined1 local_40 [8];
  shared_ptr<kratos::PortPackedStruct> ptr;
  
  local_70 = this;
  Generator::get_all_var_names_abi_cxx11_(&local_98,generator);
  for (pbVar2 = local_98.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 != local_98.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    Generator::get_var((Generator *)local_68,(string *)generator);
    iVar1 = (*((IRNode *)local_68)->_vptr_IRNode[0x17])();
    if ((char)iVar1 != '\0') {
      var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      struct_def.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      if (*(VarType *)((long)local_68 + 0x168) == PortIO) {
        sVar3 = Var::as<kratos::PortPackedStruct>((Var *)local_40);
        (**(code **)(*(long *)local_40 + 0x170))
                  (&local_80,local_40,
                   sVar3.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._M_pi);
      }
      else {
        sVar4 = Var::as<kratos::VarPackedStruct>((Var *)local_40);
        (**(code **)(*(long *)local_40 + 0x168))
                  (&local_80,local_40,
                   sVar4.super___shared_ptr<kratos::VarPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._M_pi);
      }
      std::__shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2> *)
                 &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &local_80);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ptr);
      if ((char)var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3]
                ._M_use_count == '\0') {
        process_struct_(local_70,(PackedStruct *)
                                 var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi,(Var *)local_68);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&struct_def);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&var);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

void visit(Generator* generator) override {
        auto const& var_names = generator->get_all_var_names();
        for (auto const& var_name : var_names) {
            auto var = generator->get_var(var_name);
            if (var->is_struct()) {
                std::shared_ptr<PackedStruct> struct_def;
                if (var->type() == VarType::PortIO) {
                    auto ptr = var->as<PortPackedStruct>();
                    struct_def = ptr->packed_struct();
                } else {
                    auto ptr = var->as<VarPackedStruct>();
                    struct_def = ptr->packed_struct();
                }
                if (struct_def->external) continue;
                process_struct_(struct_def.get(), var.get());
            }
        }
    }